

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::BeamData::BeamData
          (BeamData *this,KFLOAT32 AziCtr,KFLOAT32 AziSwp,KFLOAT32 EleCtr,KFLOAT32 EleSwp,
          KFLOAT32 SwpSyn)

{
  KFLOAT32 SwpSyn_local;
  KFLOAT32 EleSwp_local;
  KFLOAT32 EleCtr_local;
  KFLOAT32 AziSwp_local;
  KFLOAT32 AziCtr_local;
  BeamData *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__BeamData_0033f7a8;
  this->m_f32AziCtr = AziCtr;
  this->m_f32AziSwp = AziSwp;
  this->m_f32EleCtr = EleCtr;
  this->m_f32EleSwp = EleSwp;
  this->m_f32SwpSyn = SwpSyn;
  return;
}

Assistant:

BeamData::BeamData( KFLOAT32 AziCtr, KFLOAT32 AziSwp, KFLOAT32 EleCtr,
                    KFLOAT32 EleSwp, KFLOAT32 SwpSyn ) :
    m_f32AziCtr( AziCtr ),
    m_f32AziSwp( AziSwp ),
    m_f32EleCtr( EleCtr ),
    m_f32EleSwp( EleSwp ),
    m_f32SwpSyn( SwpSyn )
{
}